

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O1

mz_bool mz_zip_validate_mem_archive(void *pMem,size_t size,mz_uint flags,mz_zip_error *pErr)

{
  mz_bool mVar1;
  mz_bool mVar2;
  uint set_last_error;
  mz_zip_error mVar3;
  mz_zip_archive zip;
  mz_zip_archive local_98;
  
  if (pMem == (void *)0x0 || size == 0) {
    mVar3 = MZ_ZIP_INVALID_PARAMETER;
    set_last_error = 0;
    if (pErr == (mz_zip_error *)0x0) {
      return 0;
    }
  }
  else {
    local_98.m_pIO_opaque = (void *)0x0;
    local_98.m_pState = (mz_zip_internal_state *)0x0;
    local_98.m_pWrite = (mz_file_write_func)0x0;
    local_98.m_pNeeds_keepalive = (mz_file_needs_keepalive)0x0;
    local_98.m_pAlloc_opaque = (void *)0x0;
    local_98.m_pRead = (mz_file_read_func)0x0;
    local_98.m_pFree = (mz_free_func)0x0;
    local_98.m_pRealloc = (mz_realloc_func)0x0;
    local_98.m_file_offset_alignment = 0;
    local_98.m_pAlloc = (mz_alloc_func)0x0;
    local_98.m_total_files = 0;
    local_98.m_zip_mode = MZ_ZIP_MODE_INVALID;
    local_98.m_zip_type = MZ_ZIP_TYPE_INVALID;
    local_98.m_last_error = MZ_ZIP_NO_ERROR;
    local_98.m_archive_size = 0;
    local_98.m_central_directory_file_ofs = 0;
    mVar1 = mz_zip_reader_init_mem(&local_98,pMem,size,flags);
    if (mVar1 == 0) {
      set_last_error = 0;
      if (pErr == (mz_zip_error *)0x0) {
        return 0;
      }
    }
    else {
      mVar1 = mz_zip_validate_archive(&local_98,flags);
      set_last_error = (uint)(mVar1 != 0);
      mVar3 = local_98.m_last_error;
      mVar2 = mz_zip_reader_end_internal(&local_98,set_last_error);
      if (mVar2 == 0) {
        set_last_error = 0;
      }
      if (pErr == (mz_zip_error *)0x0) {
        return set_last_error;
      }
      if (mVar1 != 0) {
        mVar3 = MZ_ZIP_NO_ERROR;
      }
      if (mVar2 != 0 || mVar3 != MZ_ZIP_NO_ERROR) goto LAB_0010a099;
    }
    mVar3 = local_98.m_last_error;
  }
LAB_0010a099:
  *pErr = mVar3;
  return set_last_error;
}

Assistant:

mz_bool mz_zip_validate_mem_archive(const void *pMem, size_t size,
                                    mz_uint flags, mz_zip_error *pErr) {
  mz_bool success = MZ_TRUE;
  mz_zip_archive zip;
  mz_zip_error actual_err = MZ_ZIP_NO_ERROR;

  if ((!pMem) || (!size)) {
    if (pErr)
      *pErr = MZ_ZIP_INVALID_PARAMETER;
    return MZ_FALSE;
  }

  mz_zip_zero_struct(&zip);

  if (!mz_zip_reader_init_mem(&zip, pMem, size, flags)) {
    if (pErr)
      *pErr = zip.m_last_error;
    return MZ_FALSE;
  }

  if (!mz_zip_validate_archive(&zip, flags)) {
    actual_err = zip.m_last_error;
    success = MZ_FALSE;
  }

  if (!mz_zip_reader_end_internal(&zip, success)) {
    if (!actual_err)
      actual_err = zip.m_last_error;
    success = MZ_FALSE;
  }

  if (pErr)
    *pErr = actual_err;

  return success;
}